

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O1

string_view __thiscall Jupiter::Socket::getData(Socket *this)

{
  int iVar1;
  string_view sVar2;
  
  iVar1 = (*this->_vptr_Socket[8])();
  if (iVar1 < 1) {
    (this->m_data->buffer).m_buffer_size = 0;
  }
  sVar2._M_str = (char *)(this->m_data->buffer).m_buffer;
  sVar2._M_len = (this->m_data->buffer).m_buffer_size;
  return sVar2;
}

Assistant:

std::string_view Jupiter::Socket::getData() {
	if (this->recv() <= 0) {
		m_data->buffer.clear();
	}
	return m_data->buffer.view();
}